

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSat.c
# Opt level: O1

int Dch_NodesAreEquiv(Dch_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  Dch_Pars_t *pDVar1;
  sat_solver *s;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  timespec ts;
  int pLits [2];
  timespec local_50;
  uint local_40;
  uint local_3c;
  long local_38;
  
  pDVar1 = p->pPars;
  iVar3 = pDVar1->nBTLimit;
  p->nSatCalls = p->nSatCalls + 1;
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x35,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x36,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                  ,0x37,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar2 = p->nCallsSince;
  p->nCallsSince = iVar2 + 1;
  if ((p->pSat == (sat_solver *)0x0) ||
     (((pDVar1->nSatVarMax != 0 && (pDVar1->nSatVarMax < p->nSatVars)) &&
      (pDVar1->nCallsRecycle <= iVar2)))) {
    Dch_ManSatSolverRecycle(p);
  }
  Dch_CnfNodeAddToSolver(p,pOld);
  Dch_CnfNodeAddToSolver(p,pNew);
  s = p->pSat;
  if (s->qtail != s->qhead) {
    iVar2 = sat_solver_simplify(s);
    if (iVar2 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x4a,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x4b,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  local_40 = p->pSatVars[pOld->Id] * 2;
  local_3c = (uint)((((uint)*(ulong *)&pNew->field_0x18 ^ (uint)*(ulong *)&pOld->field_0x18) & 8) ==
                   0) + p->pSatVars[pNew->Id] * 2;
  if (p->pPars->fPolarFlip != 0) {
    if ((*(ulong *)&pOld->field_0x18 & 8) != 0) {
      local_40 = local_40 | 1;
    }
    if ((*(ulong *)&pNew->field_0x18 & 8) != 0) {
      local_3c = local_3c ^ 1;
    }
  }
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_38 = (long)iVar3;
  iVar3 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,(long)iVar3,0,0,0);
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar5 + lVar4;
  if (iVar3 == 1) {
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    lVar5 = lVar5 + lVar4;
LAB_005e5bf3:
    p->timeSatSat = p->timeSatSat + lVar5;
    p->nSatCallsSat = p->nSatCallsSat + 1;
    iVar3 = 0;
  }
  else {
    if (iVar3 != -1) {
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      lVar5 = lVar5 + lVar4;
LAB_005e5c11:
      p->timeSatUndec = p->timeSatUndec + lVar5;
      p->nSatFailsReal = p->nSatFailsReal + 1;
      return -1;
    }
    iVar3 = clock_gettime(3,&local_50);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->timeSatUnsat = p->timeSatUnsat + lVar5 + lVar4;
    local_40 = local_40 ^ 1;
    local_3c = local_3c ^ 1;
    iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                    ,0x62,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    if (p->pAigFraig->pConst1 != pOld) {
      iVar3 = p->pSatVars[pOld->Id];
      local_40 = iVar3 * 2 + 1;
      local_3c = (((uint)*(ulong *)&pNew->field_0x18 ^ (uint)*(ulong *)&pOld->field_0x18) >> 3 & 1)
                 + p->pSatVars[pNew->Id] * 2;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(ulong *)&pOld->field_0x18 & 8) != 0) {
          local_40 = iVar3 * 2;
        }
        if ((*(ulong *)&pNew->field_0x18 & 8) != 0) {
          local_3c = local_3c ^ 1;
        }
      }
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_50.tv_sec * -1000000;
      }
      iVar3 = sat_solver_solve(p->pSat,(lit *)&local_40,(lit *)&local_38,local_38,0,0,0);
      iVar2 = clock_gettime(3,&local_50);
      if (iVar2 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeSat = p->timeSat + lVar5 + lVar4;
      if (iVar3 == 1) {
        iVar3 = clock_gettime(3,&local_50);
        if (iVar3 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        lVar5 = lVar5 + lVar4;
        goto LAB_005e5bf3;
      }
      if (iVar3 != -1) {
        iVar3 = clock_gettime(3,&local_50);
        if (iVar3 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        lVar5 = lVar5 + lVar4;
        goto LAB_005e5c11;
      }
      iVar3 = clock_gettime(3,&local_50);
      if (iVar3 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->timeSatUnsat = p->timeSatUnsat + lVar5 + lVar4;
      local_40 = local_40 ^ 1;
      local_3c = local_3c ^ 1;
      iVar3 = sat_solver_addclause(p->pSat,(lit *)&local_40,(lit *)&local_38);
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchSat.c"
                      ,0x8c,"int Dch_NodesAreEquiv(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    }
    p->nSatProof = p->nSatProof + 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Runs equivalence test for the two nodes.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dch_NodesAreEquiv( Dch_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int nBTLimit = p->pPars->nBTLimit;
    int pLits[2], RetValue, RetValue1, status;
    abctime clk;
    p->nSatCalls++;

    // sanity checks
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    p->nCallsSince++;  // experiment with this!!!
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Dch_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
    Dch_CnfNodeAddToSolver( p, pOld );
    Dch_CnfNodeAddToSolver( p, pNew );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 0 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase == pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == Aig_ManConst1(p->pAigFraig) )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
    pLits[0] = toLitCond( Dch_ObjSatNum(p,pOld), 1 );
    pLits[1] = toLitCond( Dch_ObjSatNum(p,pNew), pOld->fPhase ^ pNew->fPhase );
    if ( p->pPars->fPolarFlip )
    {
        if ( pOld->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( pNew->fPhase )  pLits[1] = lit_neg( pLits[1] );
    }
clk = Abc_Clock();
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}